

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::init_train(Solver *this)

{
  value_type pRVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  ostream *poVar8;
  undefined8 uVar9;
  Reader *pRVar10;
  reference ppRVar11;
  reference pvVar12;
  reference ppDVar13;
  ulong uVar14;
  Score *pSVar15;
  Loss *pLVar16;
  Metric *pMVar17;
  long in_RDI;
  float fVar18;
  index_t num_param;
  int tmp;
  int i_3;
  index_t max_field;
  index_t max_feat;
  DMatrix *matrix;
  int i_2;
  vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> data_list;
  int i_1;
  string filename;
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  int num_reader;
  Timer timer;
  size_t threadNumber;
  undefined1 in_stack_fffffffffffff55f;
  Model *in_stack_fffffffffffff560;
  value_type *in_stack_fffffffffffff568;
  Timer *in_stack_fffffffffffff570;
  allocator *paVar19;
  uint64 in_stack_fffffffffffff578;
  value_type *in_stack_fffffffffffff580;
  size_type in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff594;
  LogSeverity s;
  size_t in_stack_fffffffffffff598;
  ThreadPool *in_stack_fffffffffffff5a0;
  Solver *this_00;
  string *in_stack_fffffffffffff5d8;
  allocator *paVar20;
  undefined8 in_stack_fffffffffffff5e0;
  string *in_stack_fffffffffffff5e8;
  undefined8 in_stack_fffffffffffff5f0;
  LogSeverity LVar21;
  ThreadPool *pool;
  Metric *in_stack_fffffffffffff610;
  Solver *in_stack_fffffffffffff630;
  size_t in_stack_fffffffffffff638;
  Reader *in_stack_fffffffffffff640;
  Solver *in_stack_fffffffffffff670;
  undefined8 in_stack_fffffffffffff768;
  ThreadPool *in_stack_fffffffffffff770;
  Score *in_stack_fffffffffffff778;
  Loss *in_stack_fffffffffffff780;
  allocator local_731;
  string local_730 [39];
  allocator local_709;
  string local_708 [32];
  Logger local_6e8;
  allocator local_6e1;
  string local_6e0 [39];
  allocator local_6b9;
  string local_6b8 [32];
  Logger local_698;
  allocator local_691;
  string local_690 [39];
  allocator local_669;
  string local_668 [36];
  Logger local_644;
  string local_640 [32];
  string local_620 [32];
  string local_600 [39];
  allocator local_5d9;
  string local_5d8 [39];
  allocator local_5b1;
  string local_5b0 [36];
  Logger local_58c;
  real_t local_588;
  allocator local_581;
  string local_580 [32];
  string local_560 [32];
  string local_540 [4];
  int in_stack_fffffffffffffac4;
  ThreadPool *in_stack_fffffffffffffac8;
  _Elt_pointer in_stack_fffffffffffffad0;
  allocator<char> local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [16];
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  string *in_stack_fffffffffffffb30;
  string *in_stack_fffffffffffffb38;
  Model *in_stack_fffffffffffffb40;
  index_t in_stack_fffffffffffffb50;
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  Logger local_458;
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [32];
  Logger local_408;
  allocator local_401;
  string local_400 [32];
  index_t local_3e0;
  int local_3dc;
  index_t local_3d8;
  index_t local_3d4;
  pointer local_3d0;
  string local_3c8 [36];
  uint local_3a4;
  Metric *local_3a0;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [32];
  Logger local_348;
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [36];
  Logger local_2f4;
  vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> local_2f0;
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [36];
  Logger local_284;
  string local_280 [36];
  int local_25c;
  undefined8 local_258;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  Logger local_200;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [36];
  Logger local_1ac;
  string local_1a8 [36];
  uint local_184;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  int local_168;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  Logger local_118;
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  Logger local_c8;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [32];
  Logger local_78;
  allocator local_71;
  string local_70 [48];
  string local_40 [48];
  ulong local_10;
  
  uVar4 = std::thread::hardware_concurrency();
  local_10 = (ulong)uVar4;
  if (*(int *)(in_RDI + 0x68) != 0) {
    local_10 = (ulong)*(int *)(in_RDI + 0x68);
  }
  pvVar7 = operator_new(0x120);
  ThreadPool::ThreadPool(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  *(void **)(in_RDI + 0x288) = pvVar7;
  StringPrintf_abi_cxx11_((char *)local_40,"xLearn uses %i threads for training task.",local_10);
  Color::print_info(&in_stack_fffffffffffff560->score_func_,(bool)in_stack_fffffffffffff55f);
  std::__cxx11::string::~string(local_40);
  Timer::Timer((Timer *)in_stack_fffffffffffff560);
  Timer::tic((Timer *)in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"Read Problem ...",&local_71);
  Color::print_action(&in_stack_fffffffffffff560->score_func_);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  Logger::Logger(&local_78,INFO);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"init_train",&local_c1);
  poVar8 = Logger::Start((LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                         in_stack_fffffffffffff5e8,(int)((ulong)in_stack_fffffffffffff5e0 >> 0x20),
                         in_stack_fffffffffffff5d8);
  std::operator<<(poVar8,"Start to init Reader");
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  LVar21 = (LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  if (((*(byte *)(in_RDI + 0x1ec) & 1) != 0) && ((*(byte *)(in_RDI + 0x1ee) & 1) != 0)) {
    if (*(int *)(in_RDI + 0x1f0) < 1) {
      Logger::Logger(&local_c8,ERR);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                 ,&local_e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_110,"init_train",&local_111);
      poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,in_stack_fffffffffffff5d8);
      poVar8 = std::operator<<(poVar8,"CHECK_GT failed ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xd3);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"hyper_param_.num_folds");
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(int *)(in_RDI + 0x1f0));
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"0");
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0);
      std::operator<<(poVar8,"\n");
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::__cxx11::string::~string(local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
      Logger::~Logger((Logger *)in_stack_fffffffffffff570);
      abort();
    }
    FileSpliter::split((FileSpliter *)in_stack_fffffffffffffad0,(string *)in_stack_fffffffffffffac8,
                       in_stack_fffffffffffffac4);
    Logger::Logger(&local_118,INFO);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"init_train",&local_161);
    poVar8 = Logger::Start((LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                           in_stack_fffffffffffff5e8,(int)((ulong)in_stack_fffffffffffff5e0 >> 0x20)
                           ,in_stack_fffffffffffff5d8);
    poVar8 = std::operator<<(poVar8,"Split file into ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,*(int *)(in_RDI + 0x1f0));
    std::operator<<(poVar8," parts.");
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  }
  local_168 = 0;
  if ((*(byte *)(in_RDI + 0x1ec) & 1) == 0) {
    local_168 = 1;
    std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::vector
              ((vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)0x22ba9e);
    LVar21 = (LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
    if (*(long *)(in_RDI + 0x128) == 0) {
      Logger::Logger(&local_2f4,ERR);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_318,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                 ,&local_319);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_340,"init_train",&local_341);
      poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,in_stack_fffffffffffff5d8);
      poVar8 = std::operator<<(poVar8,"CHECK failed ");
      poVar8 = std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x109);
      poVar8 = std::operator<<(poVar8,"\n");
      poVar8 = std::operator<<(poVar8,"hyper_param_.train_dataset");
      std::operator<<(poVar8," == NULL \n");
      std::__cxx11::string::~string(local_340);
      std::allocator<char>::~allocator((allocator<char> *)&local_341);
      std::__cxx11::string::~string(local_318);
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
      Logger::~Logger((Logger *)in_stack_fffffffffffff570);
      abort();
    }
    std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::push_back
              ((vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)
               in_stack_fffffffffffff570,(value_type *)in_stack_fffffffffffff568);
    if (*(long *)(in_RDI + 0x138) != 0) {
      local_168 = local_168 + 1;
      std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::push_back
                ((vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)
                 in_stack_fffffffffffff570,(value_type *)in_stack_fffffffffffff568);
    }
    Logger::Logger(&local_348,INFO);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_368,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"init_train",&local_391);
    poVar8 = Logger::Start((LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                           in_stack_fffffffffffff5e8,(int)((ulong)in_stack_fffffffffffff5e0 >> 0x20)
                           ,in_stack_fffffffffffff5d8);
    poVar8 = std::operator<<(poVar8,"Number of Reader: ");
    std::ostream::operator<<(poVar8,local_168);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    Logger::~Logger((Logger *)in_stack_fffffffffffff570);
    local_3a0 = (Metric *)0x0;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
               CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
               in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    for (local_3a4 = 0; (int)local_3a4 < local_168; local_3a4 = local_3a4 + 1) {
      pRVar10 = create_reader(in_stack_fffffffffffff670);
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)(int)local_3a4);
      *ppRVar11 = pRVar10;
      std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)(in_RDI + 0x250),
                 (long)(int)local_3a4);
      Reader::SetBlockSize(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)(int)local_3a4);
      Reader::SetSeed(*ppRVar11,*(int *)(in_RDI + 0x1e8));
      if ((*(byte *)(in_RDI + 0x1e4) & 1) == 0) {
        ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                             ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                              (in_RDI + 0x250),(long)(int)local_3a4);
        Reader::SetNoBin(*ppRVar11);
      }
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)(int)local_3a4);
      pRVar1 = *ppRVar11;
      ppDVar13 = std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::operator[]
                           (&local_2f0,(long)(int)local_3a4);
      (*pRVar1->_vptr_Reader[3])(pRVar1,ppDVar13);
      if ((*(byte *)(in_RDI + 1) & 1) == 0) {
        ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                             ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                              (in_RDI + 0x250),(long)(int)local_3a4);
        (*(*ppRVar11)->_vptr_Reader[8])(*ppRVar11,1);
      }
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)(int)local_3a4);
      if (*ppRVar11 == (value_type)0x0) {
        StringPrintf_abi_cxx11_
                  ((char *)local_3c8,"Cannot open initialze dataset %d",(ulong)local_3a4);
        Color::print_error(&in_stack_fffffffffffff560->score_func_);
        std::__cxx11::string::~string(local_3c8);
      }
    }
    std::vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_>::~vector
              ((vector<xLearn::DMatrix_*,_std::allocator<xLearn::DMatrix_*>_> *)
               in_stack_fffffffffffff570);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x22afeb);
    if ((*(byte *)(in_RDI + 0x1ee) & 1) == 0) {
      local_168 = local_168 + 1;
      bVar2 = std::__cxx11::string::empty();
      LVar21 = (LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20);
      iVar5 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
      if ((bVar2 & 1) == 1) {
        Logger::Logger(&local_1ac,ERR);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1d0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                   ,&local_1d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1f8,"init_train",&local_1f9);
        poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,in_stack_fffffffffffff5d8);
        poVar8 = std::operator<<(poVar8,"CHECK_NE failed ");
        poVar8 = std::operator<<(poVar8,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                                );
        poVar8 = std::operator<<(poVar8,":");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,0xe8);
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"hyper_param_.train_set_file.empty()");
        poVar8 = std::operator<<(poVar8," = ");
        bVar3 = (bool)std::__cxx11::string::empty();
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,bVar3);
        poVar8 = std::operator<<(poVar8,"\n");
        poVar8 = std::operator<<(poVar8,"true");
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,true);
        std::operator<<(poVar8,"\n");
        std::__cxx11::string::~string(local_1f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        Logger::~Logger((Logger *)in_stack_fffffffffffff570);
        abort();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) == 0) {
        local_168 = local_168 + 1;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
      }
    }
    else {
      local_168 = *(int *)(in_RDI + 0x1f0) + local_168;
      for (local_184 = 0; (int)local_184 < *(int *)(in_RDI + 0x1f0); local_184 = local_184 + 1) {
        uVar9 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_((char *)local_1a8,"%s_%d",uVar9,(ulong)local_184);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
        std::__cxx11::string::~string(local_1a8);
      }
    }
    Logger::Logger(&local_200,INFO);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_220,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,&local_221);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"init_train",&local_249);
    poVar8 = Logger::Start((LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                           in_stack_fffffffffffff5e8,(int)((ulong)in_stack_fffffffffffff5e0 >> 0x20)
                           ,in_stack_fffffffffffff5d8);
    poVar8 = std::operator<<(poVar8,"Number of Reader: ");
    std::ostream::operator<<(poVar8,local_168);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
    Logger::~Logger((Logger *)in_stack_fffffffffffff570);
    local_258 = 0;
    std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
              ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
               CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590),
               in_stack_fffffffffffff588,in_stack_fffffffffffff580);
    for (local_25c = 0; local_25c < local_168; local_25c = local_25c + 1) {
      pRVar10 = create_reader(in_stack_fffffffffffff670);
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)local_25c);
      *ppRVar11 = pRVar10;
      std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)(in_RDI + 0x250),
                 (long)local_25c);
      Reader::SetBlockSize(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)local_25c);
      Reader::SetSeed(*ppRVar11,*(int *)(in_RDI + 0x1e8));
      if ((*(byte *)(in_RDI + 0x1e4) & 1) == 0) {
        ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                             ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                              (in_RDI + 0x250),(long)local_25c);
        Reader::SetNoBin(*ppRVar11);
      }
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)local_25c);
      pRVar1 = *ppRVar11;
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_180,(long)local_25c);
      (*pRVar1->_vptr_Reader[2])(pRVar1,pvVar12);
      if ((*(byte *)(in_RDI + 1) & 1) == 0) {
        ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                             ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                              (in_RDI + 0x250),(long)local_25c);
        (*(*ppRVar11)->_vptr_Reader[8])(*ppRVar11,1);
      }
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)local_25c);
      if (*ppRVar11 == (value_type)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_180,(long)local_25c);
        uVar9 = std::__cxx11::string::c_str();
        StringPrintf_abi_cxx11_((char *)local_280,"Cannot open the file %s",uVar9);
        Color::print_error(&in_stack_fffffffffffff560->score_func_);
        std::__cxx11::string::~string(local_280);
        exit(0);
      }
      Logger::Logger(&local_284,INFO);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
                 ,&local_2a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2d0,"init_train",&local_2d1);
      poVar8 = Logger::Start((LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20),
                             in_stack_fffffffffffff5e8,
                             (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20),
                             in_stack_fffffffffffff5d8);
      poVar8 = std::operator<<(poVar8,"Init Reader: ");
      pvVar12 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_180,(long)local_25c);
      std::operator<<(poVar8,(string *)pvVar12);
      std::__cxx11::string::~string(local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      Logger::~Logger((Logger *)in_stack_fffffffffffff570);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff570);
  }
  local_3d0 = (pointer)0x0;
  local_3d4 = 0;
  local_3d8 = 0;
  local_3dc = 0;
  while( true ) {
    LVar21 = (LogSeverity)((ulong)in_stack_fffffffffffff5f0 >> 0x20);
    iVar5 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
    if (local_168 <= local_3dc) break;
    while( true ) {
      ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                           ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                            (in_RDI + 0x250),(long)local_3dc);
      iVar5 = (*(*ppRVar11)->_vptr_Reader[4])(*ppRVar11,&local_3d0);
      if (iVar5 == 0) break;
      local_3e0 = DMatrix::MaxFeat((DMatrix *)0x22c214);
      if (local_3d4 < local_3e0) {
        local_3d4 = local_3e0;
      }
      iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 8));
      if ((iVar5 == 0) &&
         (local_3e0 = DMatrix::MaxField((DMatrix *)0x22c263), local_3d8 < local_3e0)) {
        local_3d8 = local_3e0;
      }
    }
    ppRVar11 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                         ((vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *)
                          (in_RDI + 0x250),(long)local_3dc);
    (*(*ppRVar11)->_vptr_Reader[5])();
    local_3dc = local_3dc + 1;
  }
  *(index_t *)(in_RDI + 0xb8) = local_3d4 + 1;
  if (*(int *)(in_RDI + 0xb8) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_400,"Feature index is too large (overflow).",&local_401);
    Color::print_error(&in_stack_fffffffffffff560->score_func_);
    std::__cxx11::string::~string(local_400);
    std::allocator<char>::~allocator((allocator<char> *)&local_401);
    Logger::Logger(&local_408,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_428,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,&local_429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_450,"init_train",&local_451);
    in_stack_fffffffffffff670 =
         (Solver *)Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,in_stack_fffffffffffff5d8);
    std::operator<<((ostream *)in_stack_fffffffffffff670,"Feature index is too large (overflow).");
    std::__cxx11::string::~string(local_450);
    std::allocator<char>::~allocator((allocator<char> *)&local_451);
    std::__cxx11::string::~string(local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  }
  Logger::Logger(&local_458,INFO);
  paVar20 = &local_479;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,paVar20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"init_train",&local_4a1);
  poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,in_stack_fffffffffffff5d8);
  poVar8 = std::operator<<(poVar8,"Number of feature: ");
  std::ostream::operator<<(poVar8,*(uint *)(in_RDI + 0xb8));
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  StringPrintf_abi_cxx11_
            (&stack0xfffffffffffffb38,"Number of Feature: %d",(ulong)*(uint *)(in_RDI + 0xb8));
  Color::print_info(&in_stack_fffffffffffff560->score_func_,(bool)in_stack_fffffffffffff55f);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffb38);
  iVar6 = std::__cxx11::string::compare((char *)(in_RDI + 8));
  if (iVar6 == 0) {
    *(index_t *)(in_RDI + 0xc4) = local_3d8 + 1;
    Logger::Logger((Logger *)&stack0xfffffffffffffb34,INFO);
    paVar19 = &local_4f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
               ,paVar19);
    in_stack_fffffffffffff630 = (Solver *)&local_519;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_518,"init_train",(allocator *)in_stack_fffffffffffff630);
    poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,in_stack_fffffffffffff5d8);
    poVar8 = std::operator<<(poVar8,"Number of field: ");
    std::ostream::operator<<(poVar8,*(uint *)(in_RDI + 0xc4));
    std::__cxx11::string::~string(local_518);
    std::allocator<char>::~allocator(&local_519);
    std::__cxx11::string::~string(local_4f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
    Logger::~Logger((Logger *)in_stack_fffffffffffff570);
    in_stack_fffffffffffff610 = (Metric *)local_540;
    StringPrintf_abi_cxx11_
              ((char *)in_stack_fffffffffffff610,"Number of Field: %d",
               (ulong)*(uint *)(in_RDI + 0xc4));
    Color::print_info(&in_stack_fffffffffffff560->score_func_,(bool)in_stack_fffffffffffff55f);
    std::__cxx11::string::~string(local_540);
  }
  fVar18 = Timer::toc(in_stack_fffffffffffff570);
  pool = (ThreadPool *)local_560;
  StringPrintf_abi_cxx11_((char *)(double)fVar18,pool,"Time cost for reading problem: %.2f (sec)");
  Color::print_info(&in_stack_fffffffffffff560->score_func_,(bool)in_stack_fffffffffffff55f);
  std::__cxx11::string::~string(local_560);
  Timer::reset(in_stack_fffffffffffff570);
  Timer::tic((Timer *)in_stack_fffffffffffff560);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"Initialize model ...",&local_581);
  Color::print_action(&in_stack_fffffffffffff560->score_func_);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  uVar14 = std::__cxx11::string::empty();
  if ((uVar14 & 1) == 0) {
    in_stack_fffffffffffff5e8 = (string *)operator_new(0x90);
    Model::Model((Model *)in_stack_fffffffffffff670,(string *)paVar20);
    *(string **)(in_RDI + 0x248) = in_stack_fffffffffffff5e8;
  }
  else {
    pvVar7 = operator_new(0x90);
    Model::Model(in_stack_fffffffffffff560);
    *(void **)(in_RDI + 0x248) = pvVar7;
    iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 0x70));
    LVar21 = (LogSeverity)((ulong)pvVar7 >> 0x20);
    if (iVar5 == 0) {
      *(undefined4 *)(in_RDI + 0x90) = 1;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 0x70));
      if (iVar5 == 0) {
        *(undefined4 *)(in_RDI + 0x90) = 2;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)(in_RDI + 0x70));
        if (iVar5 == 0) {
          *(undefined4 *)(in_RDI + 0x90) = 3;
        }
      }
    }
    Model::Initialize(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                      in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28,in_stack_fffffffffffffb24,
                      in_stack_fffffffffffffb50,(real_t)in_stack_fffffffffffffb20);
  }
  local_588 = (real_t)Model::GetNumParameter(*(Model **)(in_RDI + 0x248));
  *(real_t *)(in_RDI + 0xbc) = local_588;
  Logger::Logger(&local_58c,INFO);
  paVar20 = &local_5b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,paVar20);
  iVar5 = (int)((ulong)paVar20 >> 0x20);
  paVar20 = &local_5d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"init_train",paVar20);
  poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,(string *)paVar20);
  poVar8 = std::operator<<(poVar8,"Number parameters: ");
  std::ostream::operator<<(poVar8,(uint)local_588);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::__cxx11::string::~string(local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  this_00 = (Solver *)local_620;
  PrintSize_abi_cxx11_(in_stack_fffffffffffff578);
  uVar9 = std::__cxx11::string::c_str();
  StringPrintf_abi_cxx11_((char *)local_600,"Model size: %s",uVar9);
  Color::print_info(&in_stack_fffffffffffff560->score_func_,(bool)in_stack_fffffffffffff55f);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_620);
  fVar18 = Timer::toc(in_stack_fffffffffffff570);
  StringPrintf_abi_cxx11_
            ((char *)(double)fVar18,local_640,"Time cost for model initial: %.2f (sec)");
  Color::print_info(&in_stack_fffffffffffff560->score_func_,(bool)in_stack_fffffffffffff55f);
  std::__cxx11::string::~string(local_640);
  pSVar15 = create_score(in_stack_fffffffffffff630);
  *(Score **)(in_RDI + 0x270) = pSVar15;
  (**(code **)(**(long **)(in_RDI + 0x270) + 0x10))
            (*(undefined4 *)(in_RDI + 0x94),*(undefined4 *)(in_RDI + 0x98),
             *(undefined4 *)(in_RDI + 0xa0),*(undefined4 *)(in_RDI + 0xa4),
             *(undefined4 *)(in_RDI + 0xa8),*(undefined4 *)(in_RDI + 0xac));
  Logger::Logger(&local_644,INFO);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_668,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_690,"init_train",&local_691);
  poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,(string *)paVar20);
  std::operator<<(poVar8,"Initialize score function.");
  std::__cxx11::string::~string(local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  pLVar16 = create_loss(in_stack_fffffffffffff630);
  *(Loss **)(in_RDI + 0x278) = pLVar16;
  s = INFO;
  Loss::Initialize(in_stack_fffffffffffff780,in_stack_fffffffffffff778,in_stack_fffffffffffff770,
                   SUB81((ulong)in_stack_fffffffffffff768 >> 0x38,0),
                   SUB81((ulong)in_stack_fffffffffffff768 >> 0x30,0),
                   (index_t)in_stack_fffffffffffff768);
  Logger::Logger(&local_698,s);
  paVar19 = &local_6b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,paVar19);
  paVar19 = &local_6e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"init_train",paVar19);
  poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,(string *)paVar20);
  std::operator<<(poVar8,"Initialize loss function.");
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
  Logger::~Logger((Logger *)in_stack_fffffffffffff570);
  pMVar17 = create_metric(this_00);
  *(Metric **)(in_RDI + 0x280) = pMVar17;
  if (*(long *)(in_RDI + 0x280) != 0) {
    Metric::Initialize(in_stack_fffffffffffff610,pool);
  }
  Logger::Logger(&local_6e8,INFO);
  paVar19 = &local_709;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_708,
             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/solver/solver.cc"
             ,paVar19);
  paVar19 = &local_731;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_730,"init_train",paVar19);
  poVar8 = Logger::Start(LVar21,in_stack_fffffffffffff5e8,iVar5,(string *)paVar20);
  std::operator<<(poVar8,"Initialize evaluation metric.");
  std::__cxx11::string::~string(local_730);
  std::allocator<char>::~allocator((allocator<char> *)&local_731);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  Logger::~Logger((Logger *)paVar19);
  return;
}

Assistant:

void Solver::init_train() {
  /*********************************************************
   *  Initialize thread pool                               *
   *********************************************************/
  size_t threadNumber = std::thread::hardware_concurrency();
  if (hyper_param_.thread_number != 0) {
    threadNumber = hyper_param_.thread_number;
  }
  pool_ = new ThreadPool(threadNumber);
  Color::print_info(
    StringPrintf("xLearn uses %i threads for training task.",
             threadNumber)
  );
  /*********************************************************
   *  Initialize Reader                                    *
   *********************************************************/
  Timer timer;
  timer.tic();
  Color::print_action("Read Problem ...");
  LOG(INFO) << "Start to init Reader";
  // Split file
  if (hyper_param_.from_file) {
    if (hyper_param_.cross_validation) {
      CHECK_GT(hyper_param_.num_folds, 0);
      splitor_.split(hyper_param_.train_set_file,
                    hyper_param_.num_folds);
      LOG(INFO) << "Split file into "
                << hyper_param_.num_folds
                << " parts.";
    }
  }
  // Get the Reader list
  int num_reader = 0;
  if (hyper_param_.from_file) {
    std::vector<std::string> file_list;
    if (hyper_param_.cross_validation) {
      num_reader += hyper_param_.num_folds;
      for (int i = 0; i < hyper_param_.num_folds; ++i) {
        std::string filename = StringPrintf("%s_%d",
            hyper_param_.train_set_file.c_str(), i);
        file_list.push_back(filename);
      }
    } else {  // do not use cross-validation
      num_reader += 1;  // training file
      CHECK_NE(hyper_param_.train_set_file.empty(), true);
      file_list.push_back(hyper_param_.train_set_file);
      if (!hyper_param_.validate_set_file.empty()) {
        num_reader += 1;  // validation file
        file_list.push_back(hyper_param_.validate_set_file);
      }
    }
    LOG(INFO) << "Number of Reader: " << num_reader;
    reader_.resize(num_reader, nullptr);
    // Create Reader
    for (int i = 0; i < num_reader; ++i) {
      reader_[i] = create_reader();
      reader_[i]->SetBlockSize(hyper_param_.block_size);
      reader_[i]->SetSeed(hyper_param_.seed);
      if (hyper_param_.bin_out == false) {
        reader_[i]->SetNoBin();
      }
      reader_[i]->Initialize(file_list[i]);
      if (!hyper_param_.on_disk) {
        reader_[i]->SetShuffle(true);
      }
      if (reader_[i] == nullptr) {
        Color::print_error(
          StringPrintf("Cannot open the file %s",
              file_list[i].c_str())
        );
        exit(0);
      }
      LOG(INFO) << "Init Reader: " << file_list[i];
    } 
  } else {
    num_reader += 1;  // training dataset
    std::vector<xLearn::DMatrix*> data_list;
    CHECK_NOTNULL(hyper_param_.train_dataset);
    data_list.push_back(hyper_param_.train_dataset);
    if (hyper_param_.valid_dataset != nullptr) {
      num_reader += 1;  // validation dataset
      data_list.push_back(hyper_param_.valid_dataset);
    }
    // Create Reader
    LOG(INFO) << "Number of Reader: " << num_reader;
    reader_.resize(num_reader, nullptr);
    for (int i = 0; i < num_reader; ++i) {
      reader_[i] = create_reader();
      reader_[i]->SetBlockSize(hyper_param_.block_size);
      reader_[i]->SetSeed(hyper_param_.seed);
      if (hyper_param_.bin_out == false) {
        reader_[i]->SetNoBin();
      }
      reader_[i]->Initialize(data_list[i]);
      if (!hyper_param_.on_disk) {
        reader_[i]->SetShuffle(true);
      }
      if (reader_[i] == nullptr) {
        Color::print_error(
          StringPrintf("Cannot open initialze dataset %d", i));
      }
    }
  }
  /*********************************************************
   *  Read problem                                         *
   *********************************************************/
  DMatrix* matrix = nullptr;
  index_t max_feat = 0, max_field = 0;
  for (int i = 0; i < num_reader; ++i) {
    while(reader_[i]->Samples(matrix)) {
      int tmp = matrix->MaxFeat();
      if (tmp > max_feat) { max_feat = tmp; }
      if (hyper_param_.score_func.compare("ffm") == 0) {
        tmp = matrix->MaxField();
        if (tmp > max_field) { max_field = tmp; }
      }
    }
    // Return to the begining of target file.
    reader_[i]->Reset();
  }
  hyper_param_.num_feature = max_feat + 1;
  // Check overflow:
  // INT_MAX +  = 0
  if (hyper_param_.num_feature == 0) {
    Color::print_error("Feature index is too large (overflow).");
    LOG(FATAL) << "Feature index is too large (overflow).";
  }
  LOG(INFO) << "Number of feature: " << hyper_param_.num_feature;
  Color::print_info(
    StringPrintf("Number of Feature: %d", 
                 hyper_param_.num_feature)
  );
  if (hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_field = max_field + 1;
    LOG(INFO) << "Number of field: " << hyper_param_.num_field;
    Color::print_info(
      StringPrintf("Number of Field: %d", 
        hyper_param_.num_field)
    );
  }
  Color::print_info(
    StringPrintf("Time cost for reading problem: %.2f (sec)",
         timer.toc())
  );
  /*********************************************************
   *  Initialize Model                                     *
   *********************************************************/
  timer.reset();
  timer.tic();
  Color::print_action("Initialize model ...");
  // Initialize parameters from reader
  if (hyper_param_.pre_model_file.empty()) {
    model_ = new Model();
    if (hyper_param_.opt_type.compare("sgd") == 0) {
      hyper_param_.auxiliary_size = 1;
    } else if (hyper_param_.opt_type.compare("adagrad") == 0) {
      hyper_param_.auxiliary_size = 2;
    } else if (hyper_param_.opt_type.compare("ftrl") == 0) {
      hyper_param_.auxiliary_size = 3;
    }
    model_->Initialize(hyper_param_.score_func,
                     hyper_param_.loss_func,
                     hyper_param_.num_feature,
                     hyper_param_.num_field,
                     hyper_param_.num_K,
                     hyper_param_.auxiliary_size,
                     hyper_param_.model_scale);
  } else { // Initialize parameter from pre-trained model
    model_ = new Model(hyper_param_.pre_model_file);
  }
  index_t num_param = model_->GetNumParameter();
  hyper_param_.num_param = num_param;
  LOG(INFO) << "Number parameters: " << num_param;
  Color::print_info(
    StringPrintf("Model size: %s", 
         PrintSize(num_param*sizeof(real_t)).c_str())
  );
  Color::print_info(
    StringPrintf("Time cost for model initial: %.2f (sec)",
         timer.toc())
  );
  /*********************************************************
   *  Initialize score function                            *
   *********************************************************/
  score_ = create_score();
  score_->Initialize(hyper_param_.learning_rate,
                     hyper_param_.regu_lambda,
                     hyper_param_.alpha,
                     hyper_param_.beta,
                     hyper_param_.lambda_1,
                     hyper_param_.lambda_2,
                     hyper_param_.opt_type);
  LOG(INFO) << "Initialize score function.";
  /*********************************************************
   *  Initialize loss function                             *
   *********************************************************/
  loss_ = create_loss();
  loss_->Initialize(score_, pool_, 
         hyper_param_.norm, 
         hyper_param_.lock_free);
  LOG(INFO) << "Initialize loss function.";
  /*********************************************************
   *  Init metric                                          *
   *********************************************************/
  metric_ = create_metric();
  if (metric_ != nullptr) {
    metric_->Initialize(pool_);
  }
  LOG(INFO) << "Initialize evaluation metric.";
}